

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::forward
          (DeconvolutionDepthWise_x86_avx512 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  pointer pMVar2;
  int *piVar3;
  long *plVar4;
  DeconvolutionDepthWise_x86_avx512 *pDVar5;
  int iVar6;
  Layer *pLVar7;
  long lVar8;
  ulong uVar9;
  void *pvVar10;
  uint uVar11;
  void *pvVar12;
  void *pvVar13;
  ulong uVar14;
  ulong uVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ParamDict pd;
  ParamDict local_240;
  int local_230;
  int local_22c;
  int local_228;
  uint local_224;
  DeconvolutionDepthWise_x86_avx512 *local_220;
  ulong local_218;
  int local_20c;
  Mat local_208;
  Mat local_1b8;
  Mat local_168;
  Option *local_118;
  pointer local_110;
  pointer local_108;
  undefined1 local_100 [8];
  undefined1 local_f8 [8];
  Allocator *local_f0;
  long local_e8;
  undefined1 local_e0 [8];
  undefined1 auStack_dc [8];
  undefined8 uStack_d4;
  Mat local_c8;
  void *local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  int iStack_68;
  Allocator *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  size_t local_40;
  
  pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar19 = pMVar1->elempack * pMVar1->c;
  local_228 = pMVar1[1].w;
  local_230 = (this->super_DeconvolutionDepthWise).group * pMVar1[1].d;
  local_22c = pMVar1[1].h;
  local_168.cstep = 0;
  local_168.data = (void *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize._0_4_ = 0;
  local_168.elemsize._4_4_ = 0;
  local_168.elempack = 0;
  local_168.allocator = (Allocator *)0x0;
  local_168.dims = 0;
  local_168.w = 0;
  local_168.h = 0;
  local_168.d = 0;
  local_168.c = 0;
  local_220 = this;
  local_100 = (undefined1  [8])bottom_blobs;
  flatten(pMVar1 + 1,&local_168,opt);
  iVar6 = -100;
  local_168.elemsize = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
  uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70);
  if ((local_168.data == (void *)0x0) ||
     (local_168.elemsize = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize),
     uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70),
     (long)local_168.c * local_168.cstep == 0)) goto LAB_0046adab;
  local_168.w = local_168.w * local_168.elempack;
  local_168.elemsize =
       CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize) /
       (ulong)(long)local_168.elempack;
  local_168.elempack = 1;
  local_1b8.cstep = 0;
  uVar11 = local_22c * local_228;
  local_1b8.data = (Allocator *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize._0_4_ = 0;
  local_1b8.elempack = 0;
  local_1b8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_1b8.elemsize._4_4_ = (int)local_1b8.refcount;
  local_1b8.allocator = (Allocator *)local_1b8.data;
  local_1b8.dims = (int)local_1b8.refcount;
  local_1b8.w = local_1b8.refcount._4_4_;
  local_1b8.c = local_1b8.elempack;
  local_110 = pMVar2;
  local_108 = pMVar1;
  Mat::create(&local_1b8,
              (int)(uVar11 * iVar19 * local_230) / (local_220->super_DeconvolutionDepthWise).group,4
              ,opt->workspace_allocator);
  pDVar5 = local_220;
  iVar6 = -100;
  local_f0 = (Allocator *)local_1b8.data;
  uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70);
  if (((Allocator *)local_1b8.data != (Allocator *)0x0) &&
     (uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70),
     (long)local_1b8.c * local_1b8.cstep != 0)) {
    iVar6 = (local_220->super_DeconvolutionDepthWise).group;
    local_e8 = (long)iVar6;
    local_224 = local_230 / iVar6;
    uVar15 = (long)iVar19 / (long)iVar6;
    if (0 < local_e8) {
      local_f8 = (undefined1  [8])local_168.data;
      uVar14 = (ulong)uVar11;
      iVar6 = (int)uVar15;
      uVar15 = uVar15 & 0xffffffff;
      local_20c = uVar11 * local_224 * iVar6;
      local_218 = 0;
      lVar8 = 0;
      do {
        local_e0 = (undefined1  [8])lVar8;
        if (0 < (int)local_224) {
          pvVar16 = (void *)((long)(_func_int ***)local_1b8.data + (long)(int)local_218 * 4);
          pvVar13 = (void *)((long)local_168.data + (long)(int)local_218 * 4);
          uVar9 = 0;
          do {
            if (0 < iVar6) {
              uVar18 = 0;
              pvVar10 = pvVar16;
              pvVar12 = pvVar13;
              do {
                if (0 < (int)uVar11) {
                  uVar17 = 0;
                  do {
                    *(undefined4 *)((long)pvVar10 + uVar17 * 4) =
                         *(undefined4 *)((long)pvVar12 + uVar17 * 4);
                    uVar17 = uVar17 + 1;
                  } while (uVar14 != uVar17);
                }
                uVar18 = uVar18 + 1;
                pvVar10 = (void *)((long)pvVar10 + uVar14 * 4);
                pvVar12 = (void *)((long)pvVar12 + local_224 * uVar14 * 4);
              } while (uVar18 != uVar15);
            }
            uVar9 = uVar9 + 1;
            pvVar16 = (void *)((long)pvVar16 + uVar15 * uVar14 * 4);
            pvVar13 = (void *)((long)pvVar13 + uVar14 * 4);
          } while (uVar9 != local_224);
        }
        local_218 = (ulong)(uint)((int)local_218 + local_20c);
        lVar8 = (long)local_e0 + 1;
      } while ((long)local_e0 + 1 != local_e8);
    }
    local_208.cstep = 0;
    local_208.data = (void *)0x0;
    local_208.refcount._0_4_ = 0;
    local_208.refcount._4_4_ = 0;
    local_208.elemsize._0_4_ = 0;
    local_208.elemsize._4_4_ = 0;
    local_208.elemsize = 0;
    local_208.elempack = 0;
    local_208.allocator = (Allocator *)0x0;
    local_208.dims = 0;
    local_208.w = 0;
    local_208.h = 0;
    local_208.d = 0;
    local_208.c = 0;
    local_118 = opt;
    if ((local_220->super_DeconvolutionDepthWise).bias_term == 0) {
LAB_0046a850:
      pLVar7 = create_layer_cpu(0x33);
      ParamDict::ParamDict(&local_240);
      ParamDict::set(&local_240,0,local_230);
      ParamDict::set(&local_240,1,local_228);
      ParamDict::set(&local_240,0xb,local_22c);
      ParamDict::set(&local_240,2,(pDVar5->super_DeconvolutionDepthWise).dilation_w);
      ParamDict::set(&local_240,0xc,(pDVar5->super_DeconvolutionDepthWise).dilation_h);
      ParamDict::set(&local_240,3,(pDVar5->super_DeconvolutionDepthWise).stride_w);
      ParamDict::set(&local_240,0xd,(pDVar5->super_DeconvolutionDepthWise).stride_h);
      ParamDict::set(&local_240,4,(pDVar5->super_DeconvolutionDepthWise).pad_left);
      ParamDict::set(&local_240,0xf,(pDVar5->super_DeconvolutionDepthWise).pad_right);
      ParamDict::set(&local_240,0xe,(pDVar5->super_DeconvolutionDepthWise).pad_top);
      ParamDict::set(&local_240,0x10,(pDVar5->super_DeconvolutionDepthWise).pad_bottom);
      ParamDict::set(&local_240,0x12,(pDVar5->super_DeconvolutionDepthWise).output_pad_right);
      ParamDict::set(&local_240,0x13,(pDVar5->super_DeconvolutionDepthWise).output_pad_bottom);
      ParamDict::set(&local_240,0x14,(pDVar5->super_DeconvolutionDepthWise).output_w);
      ParamDict::set(&local_240,0x15,(pDVar5->super_DeconvolutionDepthWise).output_h);
      ParamDict::set(&local_240,5,(pDVar5->super_DeconvolutionDepthWise).bias_term);
      ParamDict::set(&local_240,6,local_1b8.w);
      ParamDict::set(&local_240,7,(pDVar5->super_DeconvolutionDepthWise).group);
      ParamDict::set(&local_240,9,(pDVar5->super_DeconvolutionDepthWise).activation_type);
      ParamDict::set(&local_240,10,&(pDVar5->super_DeconvolutionDepthWise).activation_params);
      (*pLVar7->_vptr_Layer[2])(pLVar7,&local_240);
      lVar8 = 0x40;
      do {
        *(undefined8 *)((long)&local_c8.data + lVar8) = 0;
        *(undefined8 *)((long)&local_108 + lVar8) = 0;
        *(undefined8 *)(local_100 + lVar8) = 0;
        *(undefined8 *)(local_100 + lVar8 + 4) = 0;
        *(undefined8 *)(local_f8 + lVar8 + 4) = 0;
        *(undefined8 *)((long)&local_e8 + lVar8) = 0;
        *(undefined8 *)(&stack0xffffffffffffff20 + lVar8) = 0;
        *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xdc) + lVar8) = 0;
        *(undefined8 *)((long)&uStack_d4 + lVar8) = 0;
        lVar8 = lVar8 + 0x48;
      } while (lVar8 != 0xd0);
      piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,(int)local_1b8.refcount);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_c8.data != (Allocator *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_c8.data = local_1b8.data;
      local_c8.refcount._0_4_ = (int)local_1b8.refcount;
      local_c8.refcount._4_4_ = local_1b8.refcount._4_4_;
      local_c8.elemsize._0_4_ = (undefined4)local_1b8.elemsize;
      local_c8.elemsize._4_4_ = local_1b8.elemsize._4_4_;
      local_c8.elempack = local_1b8.elempack;
      local_c8.allocator = local_1b8.allocator;
      local_c8.w = local_1b8.w;
      local_c8.dims = local_1b8.dims;
      local_c8.h = local_1b8.h;
      local_c8.d = local_1b8.d;
      local_c8.c = local_1b8.c;
      local_c8.cstep = local_1b8.cstep;
      piVar3 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (int *)CONCAT44(uStack_74,uStack_78);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_60 == (Allocator *)0x0) {
            if (local_80 != (void *)0x0) {
              free(local_80);
            }
          }
          else {
            (*local_60->_vptr_Allocator[3])();
          }
        }
      }
      local_80 = local_208.data;
      uStack_78 = local_208.refcount._0_4_;
      uStack_74 = local_208.refcount._4_4_;
      iStack_68 = local_208.elempack;
      local_60 = local_208.allocator;
      local_58 = CONCAT44(local_208.w,local_208.dims);
      uStack_50 = CONCAT44(local_208.d,local_208.h);
      local_48 = local_208.c;
      local_40 = local_208.cstep;
      uStack_70 = local_208.elemsize;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)((undefined1 *)((long)register0x00000020 + -0xdc) + 4),
                 &local_c8);
      (*pLVar7->_vptr_Layer[3])(pLVar7,(undefined1 *)((long)register0x00000020 + -0xdc) + 4);
      ModelBinFromMatArray::~ModelBinFromMatArray
                ((ModelBinFromMatArray *)((undefined1 *)((long)register0x00000020 + -0xdc) + 4));
      (*pLVar7->_vptr_Layer[4])(pLVar7,opt);
      (*pLVar7->_vptr_Layer[7])(pLVar7,local_108,local_110,opt);
      (*pLVar7->_vptr_Layer[5])(pLVar7,opt);
      (*pLVar7->_vptr_Layer[1])(pLVar7);
      lVar8 = 0x48;
      do {
        piVar3 = *(int **)((long)&local_c8.refcount + lVar8);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar16 = *(void **)((long)&local_c8.data + lVar8);
            plVar4 = *(long **)((long)&local_c8.allocator + lVar8);
            if (plVar4 == (long *)0x0) {
              if (pvVar16 != (void *)0x0) {
                free(pvVar16);
              }
            }
            else {
              (**(code **)(*plVar4 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_c8.cstep + lVar8) = 0;
        *(undefined8 *)((long)&local_c8.refcount + lVar8 + 4) = 0;
        *(undefined8 *)((long)&local_c8.elemsize + lVar8 + 4) = 0;
        *(undefined8 *)((long)&local_c8.data + lVar8) = 0;
        *(undefined8 *)((long)&local_c8.refcount + lVar8) = 0;
        *(undefined8 *)((long)&local_c8.dims + lVar8) = 0;
        *(undefined8 *)((long)&local_c8.h + lVar8) = 0;
        *(undefined4 *)((long)&local_c8.c + lVar8) = 0;
        lVar8 = lVar8 + -0x48;
      } while (lVar8 != -0x48);
      ParamDict::~ParamDict(&local_240);
      iVar6 = 0;
    }
    else {
      flatten((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_100)->_M_impl).
              super__Vector_impl_data._M_start + 2,&local_208,opt);
      iVar6 = -100;
      local_208.elemsize = CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize);
      uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70);
      if ((local_208.data != (void *)0x0) &&
         (local_208.elemsize = CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize),
         uStack_70 = CONCAT44(uStack_70._4_4_,(undefined4)uStack_70),
         (long)local_208.c * local_208.cstep != 0)) {
        local_208.w = local_208.w * local_208.elempack;
        local_208.elemsize =
             CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize) /
             (ulong)(long)local_208.elempack;
        local_208.elempack = 1;
        goto LAB_0046a850;
      }
    }
    piVar3 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_208.allocator == (Allocator *)0x0) {
          if (local_208.data != (void *)0x0) {
            free(local_208.data);
          }
        }
        else {
          (*(local_208.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_208.cstep = 0;
    local_208.data = (void *)0x0;
    local_208.refcount._0_4_ = 0;
    local_208.refcount._4_4_ = 0;
    local_208.elemsize._0_4_ = 0;
    local_208.elemsize._4_4_ = 0;
    local_208.elempack = 0;
    local_208.dims = 0;
    local_208.w = 0;
    local_208.h = 0;
    local_208.d = 0;
    local_208.c = 0;
  }
  piVar3 = (int *)CONCAT44(local_1b8.refcount._4_4_,(int)local_1b8.refcount);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1b8.data != (Allocator *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_1b8.cstep = 0;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize._0_4_ = 0;
  local_1b8.elemsize._4_4_ = 0;
  local_1b8.elempack = 0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
LAB_0046adab:
  piVar3 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar6;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c * bottom_blob.elempack;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * group;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / group, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / group;
        const int inch_g = _num_input / group;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < group; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::DeconvolutionDepthWise);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(11, _kernel_h);
    pd.set(2, dilation_w);
    pd.set(12, dilation_h);
    pd.set(3, stride_w);
    pd.set(13, stride_h);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(14, pad_top);
    pd.set(16, pad_bottom);
    pd.set(18, output_pad_right);
    pd.set(19, output_pad_bottom);
    pd.set(20, output_w);
    pd.set(21, output_h);
    pd.set(5, bias_term);
    pd.set(6, weight_data_transposed.w);
    pd.set(7, group);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_transposed;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}